

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

XmlWriter * __thiscall
doctest::anon_unknown_15::XmlWriter::writeAttribute<doctest::String>
          (XmlWriter *this,string *name,String *attribute)

{
  stringstream rss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  doctest::operator<<(&local_190,attribute);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
        std::stringstream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }